

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O0

void multiply10(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  ExprLhs<const_int_&> this;
  undefined8 *in_RDX;
  undefined8 in_RDI;
  int v;
  AssertionHandler catchAssertionHandler;
  size_t in_stack_ffffffffffffff08;
  ITransientExpression *expr;
  SourceLineInfo *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  StringRef in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff40;
  ExprLhs<const_int_&> *in_stack_ffffffffffffff48;
  ITransientExpression local_80;
  StringRef local_70;
  undefined8 *local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_70 = operator____catch_sr((char *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  expr = &local_80;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)expr,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
             ,8);
  Catch::StringRef::StringRef
            ((StringRef *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (StringRef *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff28,(Flags)((ulong)expr >> 0x20));
  this = Catch::Decomposer::operator<=((Decomposer *)expr,(int *)0x22b575);
  Catch::ExprLhs<int_const&>::operator==(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  Catch::AssertionHandler::handleExpr((AssertionHandler *)this.m_lhs,expr);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x22b5c2);
  Catch::AssertionHandler::complete((AssertionHandler *)this.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this.m_lhs);
  iVar1 = duckdb_shell_sqlite3_value_int(*local_18);
  duckdb_shell_sqlite3_result_int(local_8,iVar1 * 10);
  return;
}

Assistant:

static void multiply10(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc == 1);
	int v = sqlite3_value_int(argv[0]);
	v *= 10;
	sqlite3_result_int(context, v);
}